

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchCommon.hpp
# Opt level: O1

void readEntry<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>>
               (_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *iter,double *val)

{
  _Elt_pointer pbVar1;
  int iVar2;
  _Elt_pointer pbVar3;
  _Map_pointer ppbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *__nptr;
  int *piVar6;
  undefined8 uVar7;
  double dVar8;
  char *local_30;
  
  pbVar3 = iter->_M_cur;
  ppbVar4 = iter->_M_node;
  pbVar1 = pbVar3 + 1;
  iter->_M_cur = pbVar1;
  if (pbVar1 == iter->_M_last) {
    iter->_M_node = ppbVar4 + 1;
    pbVar5 = ppbVar4[1];
    iter->_M_first = pbVar5;
    iter->_M_last = pbVar5 + 0x10;
    iter->_M_cur = pbVar5;
  }
  __nptr = (pbVar3->_M_dataplus)._M_p;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  dVar8 = strtod(__nptr,&local_30);
  if (local_30 == __nptr) {
    uVar7 = std::__throw_invalid_argument("stod");
    if (*piVar6 == 0) {
      *piVar6 = iVar2;
    }
    _Unwind_Resume(uVar7);
  }
  if (*piVar6 != 0) {
    if (*piVar6 != 0x22) goto LAB_0010ea22;
    dVar8 = (double)std::__throw_out_of_range("stod");
  }
  *piVar6 = iVar2;
LAB_0010ea22:
  *val = dVar8;
  return;
}

Assistant:

void readEntry(StringListIterator &iter, double &val){
    val = std::stod(*iter++);
}